

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O2

_Bool rtosc_valid_message_p(char *msg,size_t len)

{
  char cVar1;
  ushort **ppuVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  _Bool _Var8;
  
  if (*msg != '/') {
    return false;
  }
  for (uVar7 = 0; ((uVar7 & 0xffffffff) < len && (cVar1 = msg[uVar7], (long)cVar1 != 0));
      uVar7 = uVar7 + 1) {
    ppuVar2 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x40) == 0) goto LAB_0010f9b9;
  }
  uVar6 = uVar7;
  uVar3 = uVar7;
  if (uVar7 < len) {
    uVar3 = len;
  }
  for (; (uVar4 = uVar3, uVar3 != uVar6 && (uVar4 = uVar6, msg[uVar6] != ',')); uVar6 = uVar6 + 1) {
  }
  if ((uVar4 & 3) == 0 && uVar4 - uVar7 < 5) {
    sVar5 = rtosc_message_length(msg,len);
    _Var8 = sVar5 == len;
  }
  else {
LAB_0010f9b9:
    _Var8 = false;
  }
  return _Var8;
}

Assistant:

bool rtosc_valid_message_p(const char *msg, size_t len)
{
    //Validate Path Characters (assumes printable characters are sufficient)
    if(*msg != '/')
        return false;
    const char *tmp = msg;
    for(unsigned i=0; i<len; ++i) {
        if(*tmp == 0)
            break;
        if(!isprint(*tmp))
            return false;
        tmp++;
    }

    //tmp is now either pointing to a null or the end of the string
    const size_t offset1 = tmp-msg;
    size_t       offset2 = tmp-msg;
    for(; offset2<len; offset2++) {
        if(*tmp == ',')
            break;
        tmp++;
    }

    //Too many NULL bytes
    if(offset2-offset1 > 4)
        return false;

    if((offset2 % 4) != 0)
        return false;

    size_t observed_length = rtosc_message_length(msg, len);
    return observed_length == len;
}